

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O3

void __thiscall QTabWidget::paintEvent(QTabWidget *this,QPaintEvent *param_1)

{
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  QSize size;
  QSize size_00;
  QTabWidgetPrivate *d;
  long in_FS_OFFSET;
  QStyleOptionTabWidgetFrame opt;
  undefined1 *local_d8;
  QWidget *pQStack_d0;
  QStyle *local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  QPalettePrivate *pQStack_90;
  undefined1 *local_88;
  QObject *pQStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(QTabBar **)(lVar5 + 600) == (QTabBar *)0x0) ||
     (bVar3 = QTabBar::documentMode(*(QTabBar **)(lVar5 + 600)), !bVar3)) {
    local_c8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_d0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_d8);
    pQStack_d0 = &this->super_QWidget;
    local_c8 = QWidget::style(&this->super_QWidget);
    QPainter::begin((QPaintDevice *)&local_d8);
    QPainter::setRenderHint((RenderHint)&local_d8,true);
    memset((QStyleOptionTabWidgetFrame *)local_b8,0xaa,0x88);
    QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame((QStyleOptionTabWidgetFrame *)local_b8);
    (**(code **)(*(long *)&this->super_QWidget + 0x1b0))
              (this,(QStyleOptionTabWidgetFrame *)local_b8);
    local_a8 = *(undefined1 **)(lVar5 + 0x268);
    uStack_a0 = *(undefined1 **)(lVar5 + 0x270);
    (**(code **)(*(long *)local_c8 + 0xb0))
              (local_c8,8,(QStyleOptionTabWidgetFrame *)local_b8,&local_d8,pQStack_d0);
    QStyleOption::~QStyleOption((QStyleOption *)local_b8);
  }
  else {
    bVar3 = QTabBar::drawBase(*(QTabBar **)(lVar5 + 600));
    if (!bVar3) goto LAB_004abb3e;
    local_c8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_d0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    QPainter::QPainter((QPainter *)&local_d8);
    pQStack_d0 = pQVar1;
    local_c8 = QWidget::style(pQVar1);
    QPainter::begin((QPaintDevice *)&local_d8);
    QPainter::setRenderHint((RenderHint)&local_d8,true);
    lVar5 = *(long *)&(this->super_QWidget).field_0x8;
    pQVar1 = *(QWidget **)(lVar5 + 0x288);
    if ((pQVar1 != (QWidget *)0x0) && ((pQVar1->data->widget_attributes & 0x8000) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_90 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)local_b8);
      pQVar2 = pQVar1->data;
      size.wd.m_i = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
      size.ht.m_i = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1;
      QTabBarPrivate::initStyleBaseOption
                ((QStyleOptionTabBarBase *)local_b8,
                 *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600),size);
      iVar4 = QWidget::x(pQVar1);
      uStack_a0._0_4_ = uStack_a0._0_4_ + iVar4;
      local_a8._0_4_ = local_a8._0_4_ + iVar4;
      iVar4 = QWidget::y(pQVar1);
      uStack_a0._4_4_ = uStack_a0._4_4_ + iVar4;
      local_a8._4_4_ = local_a8._4_4_ + iVar4;
      (**(code **)(*(long *)local_c8 + 0xb0))
                (local_c8,0xc,(QStyleOptionTabBarBase *)local_b8,&local_d8,pQStack_d0);
      QStyleOption::~QStyleOption((QStyleOption *)local_b8);
      lVar5 = *(long *)&(this->super_QWidget).field_0x8;
    }
    pQVar1 = *(QWidget **)(lVar5 + 0x290);
    if ((pQVar1 != (QWidget *)0x0) && ((pQVar1->data->widget_attributes & 0x8000) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_90 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionTabBarBase::QStyleOptionTabBarBase((QStyleOptionTabBarBase *)local_b8);
      pQVar2 = pQVar1->data;
      size_00.wd.m_i = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
      size_00.ht.m_i = ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1;
      QTabBarPrivate::initStyleBaseOption
                ((QStyleOptionTabBarBase *)local_b8,
                 *(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600),size_00);
      iVar4 = QWidget::x(pQVar1);
      uStack_a0._0_4_ = uStack_a0._0_4_ + iVar4;
      local_a8._0_4_ = local_a8._0_4_ + iVar4;
      iVar4 = QWidget::y(pQVar1);
      uStack_a0._4_4_ = uStack_a0._4_4_ + iVar4;
      local_a8._4_4_ = local_a8._4_4_ + iVar4;
      (**(code **)(*(long *)local_c8 + 0xb0))
                (local_c8,0xc,(QStyleOptionTabBarBase *)local_b8,&local_d8,pQStack_d0);
      QStyleOption::~QStyleOption((QStyleOption *)local_b8);
    }
  }
  QPainter::~QPainter((QPainter *)&local_d8);
LAB_004abb3e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabWidget::paintEvent(QPaintEvent *)
{
    Q_D(QTabWidget);
    if (documentMode()) {
        if (d->tabs->drawBase()) {
            QStylePainter p(this, tabBar());
            if (QWidget *w = cornerWidget(Qt::TopLeftCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
            if (QWidget *w = cornerWidget(Qt::TopRightCorner); w && w->isVisible()) {
                QStyleOptionTabBarBase opt;
                QTabBarPrivate::initStyleBaseOption(&opt, tabBar(), w->size());
                opt.rect.moveLeft(w->x() + opt.rect.x());
                opt.rect.moveTop(w->y() + opt.rect.y());
                p.drawPrimitive(QStyle::PE_FrameTabBarBase, opt);
            }
        }
        return;
    }
    QStylePainter p(this);

    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.rect = d->panelRect;
    p.drawPrimitive(QStyle::PE_FrameTabWidget, opt);
}